

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O2

int xcb_input_input_state_data_serialize
              (void **_buffer,uint8_t class_id,xcb_input_input_state_data_t *_aux)

{
  long lVar1;
  void *__src;
  anon_struct_34_3_966d0470_for_button *paVar2;
  int iVar3;
  uint uVar4;
  void *__dest;
  int iVar5;
  int iVar6;
  undefined7 in_register_00000031;
  ulong uVar7;
  size_t __n;
  int iVar8;
  long in_FS_OFFSET;
  uint local_f0;
  char xcb_pad0 [3];
  iovec xcb_parts [11];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __dest = *_buffer;
  xcb_pad0[2] = '\0';
  xcb_pad0[0] = '\0';
  xcb_pad0[1] = '\0';
  memset(xcb_parts,0xaa,0xb0);
  iVar5 = (int)CONCAT71(in_register_00000031,class_id);
  if (iVar5 == 2) {
    xcb_parts[0].iov_base = &_aux->valuator;
    xcb_parts[0].iov_len = 1;
    xcb_parts[1].iov_base = &(_aux->valuator).mode;
    xcb_parts[1].iov_len = 1;
    xcb_parts[2].iov_base = (_aux->valuator).valuators;
    xcb_parts[2].iov_len = (ulong)(_aux->valuator).num_valuators << 2;
    iVar5 = (int)xcb_parts[2].iov_len;
    iVar3 = 0;
    uVar4 = 3;
    iVar6 = 2;
  }
  else {
    if (iVar5 == 1) {
      xcb_parts[0].iov_base = &_aux->button;
      xcb_parts[0].iov_len = 1;
      xcb_parts[1].iov_base = &local_f0;
      xcb_parts[1].iov_len = 1;
      paVar2 = &_aux->button;
    }
    else {
      if (iVar5 != 0) {
        iVar3 = -2;
        uVar4 = 0xffffffff;
        iVar6 = 0;
        iVar8 = 0;
        iVar5 = 0;
        goto LAB_0017eb5f;
      }
      xcb_parts[0].iov_base = _aux;
      xcb_parts[0].iov_len = 1;
      xcb_parts[1].iov_base = &local_f0;
      xcb_parts[1].iov_len = 1;
      paVar2 = (anon_struct_34_3_966d0470_for_button *)&_aux->key;
    }
    xcb_parts[2].iov_base = paVar2->buttons;
    iVar5 = 0x22;
    iVar3 = -2;
    iVar6 = 0;
    xcb_parts[2].iov_len = 0x20;
    uVar4 = 0;
  }
  xcb_parts[1].iov_len = 1;
  xcb_parts[0].iov_len = 1;
  iVar8 = 3;
LAB_0017eb5f:
  uVar4 = iVar3 - iVar5 & uVar4;
  local_f0 = uVar4;
  if (uVar4 != 0) {
    *(char **)((long)&xcb_parts[0].iov_base + (ulong)(uint)(iVar8 << 4)) = xcb_pad0;
    *(ulong *)((long)&xcb_parts[0].iov_len + (ulong)(uint)(iVar8 << 4)) = (ulong)uVar4;
    iVar8 = iVar8 + 1;
    local_f0 = 0;
  }
  uVar4 = iVar6 + iVar5 + uVar4;
  if (__dest == (void *)0x0) {
    __dest = malloc((ulong)uVar4);
    *_buffer = __dest;
  }
  for (uVar7 = 0; (uint)(iVar8 << 4) != uVar7; uVar7 = uVar7 + 0x10) {
    __src = *(void **)((long)&xcb_parts[0].iov_base + uVar7);
    __n = *(size_t *)((long)&xcb_parts[0].iov_len + uVar7);
    if (__src != (void *)0x0) {
      if (__n == 0) {
        __n = 0;
      }
      else {
        memcpy(__dest,__src,__n);
      }
    }
    __dest = (void *)((long)__dest + __n);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar4;
  }
  __stack_chk_fail();
}

Assistant:

int
xcb_input_input_state_data_serialize (void                               **_buffer,
                                      uint8_t                              class_id,
                                      const xcb_input_input_state_data_t  *_aux)
{
    char *xcb_out = *_buffer;
    unsigned int xcb_buffer_len = 0;
    unsigned int xcb_align_to = 0;
    unsigned int xcb_padding_offset = 2;

    unsigned int xcb_pad = 0;
    char xcb_pad0[3] = {0, 0, 0};
    struct iovec xcb_parts[11];
    unsigned int xcb_parts_idx = 0;
    unsigned int xcb_block_len = 0;
    unsigned int i;
    char *xcb_tmp;

    if(class_id == XCB_INPUT_INPUT_CLASS_KEY) {
        /* xcb_input_input_state_data_t.key.num_keys */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->key.num_keys;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.key.pad0 */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &xcb_pad;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.key.keys */
        xcb_parts[xcb_parts_idx].iov_base = (char *) _aux->key.keys;
        xcb_block_len += 32;
        xcb_parts[xcb_parts_idx].iov_len = 32;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
    }
    if(class_id == XCB_INPUT_INPUT_CLASS_BUTTON) {
        /* xcb_input_input_state_data_t.button.num_buttons */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->button.num_buttons;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.button.pad1 */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &xcb_pad;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.button.buttons */
        xcb_parts[xcb_parts_idx].iov_base = (char *) _aux->button.buttons;
        xcb_block_len += 32;
        xcb_parts[xcb_parts_idx].iov_len = 32;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
    }
    if(class_id == XCB_INPUT_INPUT_CLASS_VALUATOR) {
        /* xcb_input_input_state_data_t.valuator.num_valuators */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->valuator.num_valuators;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.valuator.mode */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->valuator.mode;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* insert padding */
        xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
        xcb_buffer_len += xcb_block_len + xcb_pad;
        if (0 != xcb_pad) {
            xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
            xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
            xcb_parts_idx++;
            xcb_pad = 0;
        }
        xcb_block_len = 0;
        xcb_padding_offset = 0;
        /* valuators */
        xcb_parts[xcb_parts_idx].iov_base = (char *) _aux->valuator.valuators;
        xcb_block_len += _aux->valuator.num_valuators * sizeof(int32_t);
        xcb_parts[xcb_parts_idx].iov_len = _aux->valuator.num_valuators * sizeof(int32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int32_t);
    }
    /* insert padding */
    xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
    xcb_buffer_len += xcb_block_len + xcb_pad;
    if (0 != xcb_pad) {
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
        xcb_parts_idx++;
        xcb_pad = 0;
    }
    xcb_block_len = 0;
    xcb_padding_offset = 0;

    if (NULL == xcb_out) {
        /* allocate memory */
        xcb_out = malloc(xcb_buffer_len);
        *_buffer = xcb_out;
    }

    xcb_tmp = xcb_out;
    for(i=0; i<xcb_parts_idx; i++) {
        if (0 != xcb_parts[i].iov_base && 0 != xcb_parts[i].iov_len)
            memcpy(xcb_tmp, xcb_parts[i].iov_base, xcb_parts[i].iov_len);
        if (0 != xcb_parts[i].iov_len)
            xcb_tmp += xcb_parts[i].iov_len;
    }

    return xcb_buffer_len;
}